

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::append
          (xpath_node_set_raw *this,xpath_node *begin_,xpath_node *end_,xpath_allocator *alloc)

{
  ulong uVar1;
  xpath_node *pxVar2;
  size_t old_size;
  size_t __n;
  long lVar3;
  
  if (begin_ != end_) {
    pxVar2 = this->_begin;
    lVar3 = (long)this->_end - (long)pxVar2;
    old_size = (long)this->_eos - (long)pxVar2;
    __n = (long)end_ - (long)begin_;
    uVar1 = ((long)__n >> 4) + (lVar3 >> 4);
    if ((ulong)((long)old_size >> 4) < uVar1) {
      pxVar2 = (xpath_node *)xpath_allocator::reallocate(alloc,pxVar2,old_size,uVar1 * 0x10);
      if (pxVar2 == (xpath_node *)0x0) {
        return;
      }
      this->_begin = pxVar2;
      pxVar2 = (xpath_node *)(lVar3 + (long)pxVar2);
      this->_end = pxVar2;
      this->_eos = (xpath_node *)((long)pxVar2 + __n);
    }
    memcpy(this->_end,begin_,__n);
    this->_end = (xpath_node *)((long)this->_end + __n);
  }
  return;
}

Assistant:

void append(const xpath_node* begin_, const xpath_node* end_, xpath_allocator* alloc)
		{
			if (begin_ == end_) return;

			size_t size_ = static_cast<size_t>(_end - _begin);
			size_t capacity = static_cast<size_t>(_eos - _begin);
			size_t count = static_cast<size_t>(end_ - begin_);

			if (size_ + count > capacity)
			{
				// reallocate the old array or allocate a new one
				xpath_node* data = static_cast<xpath_node*>(alloc->reallocate(_begin, capacity * sizeof(xpath_node), (size_ + count) * sizeof(xpath_node)));
				if (!data) return;

				// finalize
				_begin = data;
				_end = data + size_;
				_eos = data + size_ + count;
			}

			memcpy(_end, begin_, count * sizeof(xpath_node));
			_end += count;
		}